

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

NativeWindowFactory *
eglu::selectNativeWindowFactory(NativeDisplayFactory *factory,CommandLine *cmdLine)

{
  NativeWindowFactoryRegistry *this;
  int iVar1;
  char *__s;
  NativeWindowFactory *pNVar2;
  AbstractFactory *pAVar3;
  undefined4 extraout_var;
  FactoryBase *this_00;
  char *pcVar4;
  NotSupportedError *pNVar5;
  size_t ndx;
  ulong index;
  allocator<char> local_d1;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = &factory->m_nativeWindowRegistry;
  __s = tcu::CommandLine::getEGLWindowType(cmdLine);
  if (__s == (char *)0x0) {
    if ((factory->m_nativeWindowRegistry).m_registry.m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (factory->m_nativeWindowRegistry).m_registry.m_factories.
        super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pNVar2 = tcu::FactoryRegistry<eglu::NativeWindowFactory>::getDefaultFactory(this);
      return pNVar2;
    }
    pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"No factory supporting EGL \'",(allocator<char> *)&local_70);
    std::operator+(&local_b0,&local_90,"window");
    std::operator+(&local_d0,&local_b0,"\' type");
    tcu::NotSupportedError::NotSupportedError
              (pNVar5,local_d0._M_dataplus._M_p,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
               ,0x1ce);
    __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,__s,(allocator<char> *)&local_b0);
  pNVar2 = (NativeWindowFactory *)
           tcu::GenericFactoryRegistry::getFactoryByName(&this->m_registry,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (pNVar2 != (NativeWindowFactory *)0x0) {
    return pNVar2;
  }
  tcu::print("ERROR: Unknown or unsupported EGL %s type \'%s\'","window",__s);
  tcu::print("Available EGL %s types:\n","window");
  for (index = 0;
      index < (ulong)((long)(factory->m_nativeWindowRegistry).m_registry.m_factories.
                            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(factory->m_nativeWindowRegistry).m_registry.m_factories.
                            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); index = index + 1) {
    pAVar3 = tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,index);
    iVar1 = (*pAVar3->_vptr_AbstractFactory[2])(pAVar3);
    this_00 = (FactoryBase *)tcu::GenericFactoryRegistry::getFactoryByIndex(&this->m_registry,index)
    ;
    pcVar4 = tcu::FactoryBase::getDescription(this_00);
    tcu::print("  %s: %s\n",CONCAT44(extraout_var,iVar1),pcVar4);
  }
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Unsupported or unknown EGL ",&local_d1);
  std::operator+(&local_70,&local_50,"window");
  std::operator+(&local_90,&local_70," type \'");
  std::operator+(&local_b0,&local_90,__s);
  std::operator+(&local_d0,&local_b0,"\'");
  tcu::NotSupportedError::NotSupportedError
            (pNVar5,local_d0._M_dataplus._M_p,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluUtil.cpp"
             ,0x1c8);
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const NativeWindowFactory& selectNativeWindowFactory (const NativeDisplayFactory& factory, const tcu::CommandLine& cmdLine)
{
	return selectFactory(factory.getNativeWindowRegistry(), "window", cmdLine.getEGLWindowType());
}